

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdEquall(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._2_1_ = cmd.rB;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uint)ctx_local._2_1_ << 3);
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  GenCodeLoadInt64FromPointer(ctx,rEDX,rEDX,ctx_local._3_1_,ctx_local._4_4_);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG_REG(&ctx->ctx,o_xor,rECX,rECX);
  EMIT_OP_REG_REG(&ctx->ctx,o_cmp64,rEAX,rEDX);
  EMIT_OP_REG(&ctx->ctx,o_sete,rECX);
  ctx_local._1_1_ = cmd.rA;
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3,rECX);
  return;
}

Assistant:

void GenCodeCmdEquall(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rB * 8); // Load long lhs value

	GenCodeLoadInt64FromPointer(ctx, rRDX, rRDX, cmd.rC, cmd.argument);

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_REG(ctx.ctx, o_xor, rECX, rECX);
	EMIT_OP_REG_REG(ctx.ctx, o_cmp64, rRAX, rRDX);
	EMIT_OP_REG(ctx.ctx, o_sete, rECX);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rECX); // Store long to target
#else
	// Load long RHS value into EAX:EDX
	x86GenCodeLoadInt64FromPointer(ctx, rEDX, rECX, rEDX, cmd.rC, cmd.argument);

	EMIT_OP_REG_REG(ctx.ctx, o_xor, rEAX, rEAX);
	EMIT_OP_REG_RPTR(ctx.ctx, o_xor, rECX, sDWORD, rREG, cmd.rB * 8);
	EMIT_OP_REG_RPTR(ctx.ctx, o_xor, rEDX, sDWORD, rREG, cmd.rB * 8 + 4);
	EMIT_OP_REG_REG(ctx.ctx, o_or, rECX, rEDX);
	EMIT_REG_READ(ctx.ctx, rECX); // setcc implicitly reads the result of the last value-producing instruction
	EMIT_OP_REG(ctx.ctx, o_sete, rEAX);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store int to target
#endif
}